

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O2

nsync_note nsync_note_new(nsync_note parent,nsync_time abs_deadline)

{
  __time_t _Var1;
  __syscall_slong_t _Var2;
  int iVar3;
  nsync_note n;
  nsync_time *pnVar4;
  nsync_dll_list_ pnVar5;
  nsync_time a;
  nsync_time a_00;
  
  n = (nsync_note)calloc(1,0x70);
  if (n == (nsync_note)0x0) {
    return (nsync_note)0x0;
  }
  nsync_dll_init_((nsync_dll_element_ *)n,n);
  (n->expiry_time).tv_sec = abs_deadline.tv_sec;
  (n->expiry_time).tv_nsec = abs_deadline.tv_nsec;
  n->expiry_time_valid = 1;
  iVar3 = nsync_note_is_notified(n);
  if (parent != (nsync_note)0x0) {
    if (iVar3 == 0) {
      nsync_mu_lock(&parent->note_mu);
      if (parent->notified == 0) {
        if (parent->expiry_time_valid == 0) {
          pnVar4 = &nsync_time_no_deadline;
        }
        else {
          pnVar4 = &parent->expiry_time;
        }
      }
      else {
        pnVar4 = &nsync_time_zero;
      }
      _Var1 = pnVar4->tv_sec;
      _Var2 = pnVar4->tv_nsec;
      a.tv_nsec = _Var2;
      a.tv_sec = _Var1;
      iVar3 = nsync_time_cmp(a,abs_deadline);
      if (iVar3 < 0) {
        (n->expiry_time).tv_sec = _Var1;
        (n->expiry_time).tv_nsec = _Var2;
        n->expiry_time_valid = 1;
      }
      a_00.tv_nsec = _Var2;
      a_00.tv_sec = _Var1;
      iVar3 = nsync_time_cmp(a_00,(nsync_time)ZEXT816((ulong)0));
      if (0 < iVar3) {
        n->parent = parent;
        pnVar5 = nsync_dll_make_last_in_list_(parent->children,(nsync_dll_element_ *)n);
        parent->children = pnVar5;
      }
      nsync_mu_unlock(&parent->note_mu);
      return n;
    }
    return n;
  }
  return n;
}

Assistant:

nsync_note nsync_note_new (nsync_note parent,
			   nsync_time abs_deadline) {
	nsync_note n = (nsync_note) malloc (sizeof (*n));
	if (n != NULL) {
		memset ((void *) n, 0, sizeof (*n));
		nsync_dll_init_ (&n->parent_child_link, n);
		set_expiry_time (n, abs_deadline);
		if (!nsync_note_is_notified (n) && parent != NULL) {
			nsync_time parent_time;
			nsync_mu_lock (&parent->note_mu);
			parent_time = NOTIFIED_TIME (parent);
			if (nsync_time_cmp (parent_time, abs_deadline) < 0) {
				set_expiry_time (n, parent_time);
			}
			if (nsync_time_cmp (parent_time, nsync_time_zero) > 0) {
				n->parent = parent;
				parent->children = nsync_dll_make_last_in_list_ (parent->children,
					&n->parent_child_link);
			}
			nsync_mu_unlock (&parent->note_mu);
		}
	}
	return (n);
}